

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O3

bool yolo_params_parse(int argc,char **argv,yolo_params *params)

{
  char *pcVar1;
  char *pcVar2;
  long *__nptr;
  int iVar3;
  int *piVar4;
  undefined8 extraout_RAX;
  int iVar5;
  float fVar6;
  string arg;
  allocator<char> local_95;
  int local_94;
  long *local_90 [2];
  long local_80 [2];
  string *local_70;
  string *local_68;
  string *local_60;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  
  if (1 < argc) {
    local_70 = &params->fname_out;
    local_68 = &params->fname_inp;
    local_60 = &params->model;
    iVar5 = 1;
    local_94 = argc;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_90,argv[iVar5],(allocator<char> *)local_58);
      iVar3 = std::__cxx11::string::compare((char *)local_90);
      if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_90), iVar3 == 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_58,argv[(long)iVar5 + 1],&local_95);
        __nptr = local_58[0];
        piVar4 = __errno_location();
        iVar3 = *piVar4;
        *piVar4 = 0;
        fVar6 = strtof((char *)__nptr,(char **)&local_38);
        if (local_38 == __nptr) {
          std::__throw_invalid_argument("stof");
LAB_00104e0c:
          std::__throw_out_of_range("stof");
LAB_00104e18:
          iVar5 = std::__cxx11::string::compare((char *)local_90);
          if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)local_90), iVar5 == 0))
          {
            yolo_params_parse();
          }
          yolo_params_parse();
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          _Unwind_Resume(extraout_RAX);
        }
        if (*piVar4 == 0) {
          *piVar4 = iVar3;
        }
        else if (*piVar4 == 0x22) goto LAB_00104e0c;
        params->thresh = fVar6;
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_90);
        if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_90), iVar3 == 0)) {
          pcVar1 = argv[(long)iVar5 + 1];
          pcVar2 = (char *)(params->model)._M_string_length;
          strlen(pcVar1);
          std::__cxx11::string::_M_replace((ulong)local_60,0,pcVar2,(ulong)pcVar1);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_90);
          if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_90), iVar3 == 0))
          {
            pcVar1 = argv[(long)iVar5 + 1];
            pcVar2 = (char *)(params->fname_inp)._M_string_length;
            strlen(pcVar1);
            std::__cxx11::string::_M_replace((ulong)local_68,0,pcVar2,(ulong)pcVar1);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)local_90);
            if ((iVar3 != 0) &&
               (iVar3 = std::__cxx11::string::compare((char *)local_90), iVar3 != 0))
            goto LAB_00104e18;
            pcVar1 = argv[(long)iVar5 + 1];
            pcVar2 = (char *)(params->fname_out)._M_string_length;
            strlen(pcVar1);
            std::__cxx11::string::_M_replace((ulong)local_70,0,pcVar2,(ulong)pcVar1);
          }
        }
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      iVar5 = iVar5 + 2;
    } while (iVar5 < local_94);
  }
  return true;
}

Assistant:

bool yolo_params_parse(int argc, char ** argv, yolo_params & params) {
    for (int i = 1; i < argc; i++) {
        std::string arg = argv[i];

        if (arg == "-th" || arg == "--thresh") {
            params.thresh = std::stof(argv[++i]);
        } else if (arg == "-m" || arg == "--model") {
            params.model = argv[++i];
        } else if (arg == "-i" || arg == "--inp") {
            params.fname_inp = argv[++i];
        } else if (arg == "-o" || arg == "--out") {
            params.fname_out = argv[++i];
        } else if (arg == "-h" || arg == "--help") {
            yolo_print_usage(argc, argv, params);
            exit(0);
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            yolo_print_usage(argc, argv, params);
            exit(0);
        }
    }

    return true;
}